

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool nite::keyboardCheck(uint key)

{
  Uint8 UVar1;
  uint uVar2;
  int iVar3;
  SDL_Scancode k;
  uint key_local;
  
  uVar2 = SDL_GetScancodeFromKey(niteKeys[key]);
  if (keyboardCheck(unsigned_int)::state == '\0') {
    iVar3 = __cxa_guard_acquire(&keyboardCheck(unsigned_int)::state);
    if (iVar3 != 0) {
      keyboardCheck::state = (Uint8 *)SDL_GetKeyboardState(0);
      __cxa_guard_release(&keyboardCheck(unsigned_int)::state);
    }
  }
  if (key < 100) {
    UVar1 = keyboardCheck::state[uVar2];
  }
  else {
    UVar1 = '\0';
  }
  return UVar1 != '\0';
}

Assistant:

bool nite::keyboardCheck(unsigned key){
	SDL_Scancode k = SDL_GetScancodeFromKey(niteKeys[key]);
	static const Uint8 *state = SDL_GetKeyboardState(NULL);
	return (key >= niteKeysn-1 ? 0 : state[k]);
}